

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O3

void place_worm_tail_randomly(monst *worm,xchar x,xchar y)

{
  byte bVar1;
  level *lev;
  wseg *pwVar2;
  wseg *pwVar3;
  byte bVar4;
  boolean bVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  byte bVar9;
  char *s;
  wseg *__ptr;
  byte local_64;
  
  bVar1 = worm->wormno;
  if (bVar1 == 0) {
    s = "place_worm_tail_randomly: worm->wormno was 0";
  }
  else {
    lev = worm->dlevel;
    pwVar2 = lev->wtails[bVar1];
    s = "place_worm_tail_randomly: wormno is set without a tail!";
    if ((pwVar2 != (wseg *)0x0) && (lev->wheads[bVar1] != (wseg *)0x0)) {
      lev->wheads[bVar1] = pwVar2;
      __ptr = pwVar2->nseg;
      pwVar2->nseg = (wseg *)0x0;
      pwVar2->wx = x;
      pwVar2->wy = y;
      while( true ) {
        if (__ptr == (wseg *)0x0) {
          return;
        }
        local_64 = y - 0x15;
        bVar8 = 0;
        while( true ) {
          uVar6 = mt_random();
          if (x < '\x02') {
            uVar6 = uVar6 & 1;
          }
          else if ((byte)x < 0x50) {
            uVar6 = ~((uVar6 / 3) * 3) + uVar6;
          }
          else {
            uVar6 = -(uVar6 & 1);
          }
          if (uVar6 == 0) {
            bVar4 = (y < '\x02') * '\x02' - 1;
            if (0xec < local_64) {
              uVar7 = mt_random();
              bVar4 = -((uVar7 & 1) == 0) | 1;
            }
          }
          else {
            uVar7 = mt_random();
            bVar4 = (byte)uVar7;
            if (y < '\x02') {
              bVar4 = bVar4 & 1;
            }
            else if ((byte)y < 0x15) {
              bVar4 = ~((char)(uVar7 / 3) * '\x03') + bVar4;
            }
            else {
              bVar4 = -(bVar4 & 1);
            }
          }
          bVar9 = (char)uVar6 + x;
          bVar4 = bVar4 + y;
          bVar5 = goodpos(lev,(int)(char)bVar9,(int)(char)bVar4,worm,0);
          if (bVar5 != '\0') break;
          bVar8 = bVar8 + 1;
          if (bVar8 == 0x33) goto LAB_0028bbb6;
        }
        if (0x31 < bVar8) break;
        worm->dlevel->monsters[(char)bVar9][(char)bVar4] = worm;
        __ptr->wx = bVar9;
        __ptr->wy = bVar4;
        lev->wtails[bVar1] = __ptr;
        pwVar3 = __ptr->nseg;
        __ptr->nseg = pwVar2;
        pwVar2 = lev->wtails[bVar1];
        newsym((int)(char)bVar9,(int)(char)bVar4);
        __ptr = pwVar3;
        x = bVar9;
        y = bVar4;
      }
LAB_0028bbb6:
      do {
        pwVar2 = __ptr->nseg;
        if ((long)__ptr->wx != 0) {
          lev->monsters[__ptr->wx][__ptr->wy] = (monst *)0x0;
        }
        free(__ptr);
        __ptr = pwVar2;
      } while (pwVar2 != (wseg *)0x0);
      return;
    }
  }
  warning(s);
  return;
}

Assistant:

void place_worm_tail_randomly(struct monst *worm, xchar x, xchar y)
{
    int wnum = worm->wormno;
    struct level *lev = worm->dlevel;
    struct wseg *curr = lev->wtails[wnum];
    struct wseg *new_tail;
    xchar ox = x, oy = y;

    if (!wnum) {
	warning("place_worm_tail_randomly: worm->wormno was 0");
	return;
    }

    if (wnum && (!lev->wtails[wnum] || !lev->wheads[wnum]) ) {
	warning("place_worm_tail_randomly: wormno is set without a tail!");
	return;
    }

    lev->wheads[wnum] = new_tail = curr;
    curr = curr->nseg;
    new_tail->nseg = NULL;
    new_tail->wx = x;
    new_tail->wy = y;

    while (curr)  {
	xchar nx, ny;
	char tryct = 0;

	/* pick a random direction from x, y and search for goodpos() */

	do {
	    random_dir(ox, oy, &nx, &ny);
	} while (!goodpos(lev, nx, ny, worm, 0) && (tryct++ < 50));

	if (tryct < 50)  {
	    place_worm_seg(worm, nx, ny);
	    curr->wx = ox = nx;
	    curr->wy = oy = ny;
	    lev->wtails[wnum] = curr;
	    curr = curr->nseg;
	    lev->wtails[wnum]->nseg = new_tail;
	    new_tail = lev->wtails[wnum];
	    newsym(nx, ny);
	} else {			/* Oops.  Truncate because there was */
	    toss_wsegs(lev, curr, FALSE);    /* no place for the rest of it */
	    curr = NULL;
	}
    }
}